

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

int __thiscall
mp::internal::TextReader<fmt::Locale>::ReadUInt(TextReader<fmt::Locale> *this,int *accumulator)

{
  uint uVar1;
  int iVar2;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_28;
  
  uVar1 = ReadUInt<int>(this);
  iVar2 = *accumulator;
  if ((int)(uVar1 ^ 0x7fffffff) < iVar2) {
    local_38 = 0;
    uStack_30 = 0;
    local_28.types_ = 0;
    local_28.field_1.values_ = (Value *)&local_38;
    DoReportError(this,(this->super_ReaderBase).token_,(CStringRef)0x16ed22,&local_28);
    iVar2 = *accumulator;
  }
  *accumulator = iVar2 + uVar1;
  return uVar1;
}

Assistant:

int ReadUInt(int &accumulator) {
    int value = ReadUInt();
    if (accumulator > std::numeric_limits<int>::max() - value)
      ReportError("integer overflow");
    accumulator += value;
    return value;
  }